

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O2

void __thiscall r_code::View::~View(View *this)

{
  long lVar1;
  
  (this->super__Object)._vptr__Object = (_func_int **)&PTR__View_001d0450;
  lVar1 = 0x58;
  do {
    r_code::Atom::~Atom((Atom *)((long)this->references + lVar1 + -0x10));
    lVar1 = lVar1 + -4;
  } while (lVar1 != 0x24);
  core::P<r_code::Code>::~P(&this->object);
  return;
}

Assistant:

virtual ~View() {}